

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  undefined4 *returnvalue;
  N_Vector y;
  long *returnvalue_00;
  void *returnvalue_01;
  void *pvVar4;
  void *returnvalue_02;
  FILE *pFVar5;
  undefined8 uVar6;
  sunrealtype t;
  int retval;
  int indexB;
  N_Vector local_88;
  sunrealtype time;
  SUNContext sunctx;
  N_Vector local_70;
  FILE *local_68;
  void *local_60;
  int ncheck;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  puts("\nAdjoint Sensitivity Example for Chemical Kinetics");
  puts("-------------------------------------------------\n");
  puts("ODE: dy1/dt = -p1*y1 + p2*y2*y3");
  puts("     dy2/dt =  p1*y1 - p2*y2*y3 - p3*(y2)^2");
  puts("     dy3/dt =  p3*(y2)^2\n");
  puts("Find dG/dp for");
  puts("     G = int_t0^tB0 g(t,p,y) dt");
  puts("     g(t,p,y) = y3\n\n");
  returnvalue = (undefined4 *)malloc(0x18);
  iVar2 = check_retval(returnvalue,"malloc",2);
  if (iVar2 == 0) {
    *returnvalue = 0x47ae147b;
    returnvalue[1] = 0x3fa47ae1;
    returnvalue[2] = 0;
    returnvalue[3] = 0x40c38800;
    *(undefined8 *)(returnvalue + 4) = 0x417c9c3800000000;
    retval = SUNContext_Create(0,&sunctx);
    iVar2 = 1;
    iVar3 = check_retval(&retval,"SUNContext_Create",1);
    if (iVar3 == 0) {
      y = (N_Vector)N_VNew_Serial(3,sunctx);
      iVar3 = check_retval(y,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        puVar1 = *(undefined8 **)((long)y->content + 0x10);
        *puVar1 = 0x3ff0000000000000;
        puVar1[1] = 0;
        puVar1[2] = 0;
        returnvalue_00 = (long *)N_VNew_Serial(1,sunctx);
        iVar3 = check_retval(returnvalue_00,"N_VNew_Serial",0);
        if (iVar3 == 0) {
          **(undefined8 **)(*returnvalue_00 + 0x10) = 0;
          puts("Create and allocate CVODES memory for forward runs");
          returnvalue_01 = (void *)CVodeCreate(2,sunctx);
          local_38 = returnvalue_01;
          iVar3 = check_retval(returnvalue_01,"CVodeCreate",0);
          if (iVar3 == 0) {
            retval = CVodeInit(0,returnvalue_01,f,y);
            iVar2 = 1;
            iVar3 = check_retval(&retval,"CVodeInit",1);
            if (iVar3 == 0) {
              retval = CVodeWFtolerances(returnvalue_01,ewt);
              iVar2 = 1;
              iVar3 = check_retval(&retval,"CVodeWFtolerances",1);
              if (iVar3 == 0) {
                retval = CVodeSetUserData(returnvalue_01,returnvalue);
                iVar2 = 1;
                iVar3 = check_retval(&retval,"CVodeSetUserData",1);
                if (iVar3 == 0) {
                  pvVar4 = (void *)SUNDenseMatrix(3,3,sunctx);
                  iVar3 = check_retval(pvVar4,"SUNDenseMatrix",0);
                  if (iVar3 == 0) {
                    returnvalue_02 = (void *)SUNLinSol_Dense(y,pvVar4,sunctx);
                    local_48 = pvVar4;
                    iVar3 = check_retval(returnvalue_02,"SUNLinSol_Dense",0);
                    if (iVar3 == 0) {
                      retval = CVodeSetLinearSolver(returnvalue_01,returnvalue_02,local_48);
                      iVar2 = 1;
                      iVar3 = check_retval(&retval,"CVodeSetLinearSolver",1);
                      if (iVar3 == 0) {
                        retval = CVodeSetJacFn(returnvalue_01,Jac);
                        iVar2 = 1;
                        iVar3 = check_retval(&retval,"CVodeSetJacFn",1);
                        if (iVar3 == 0) {
                          retval = CVodeQuadInit(returnvalue_01,fQ,returnvalue_00);
                          iVar2 = 1;
                          iVar3 = check_retval(&retval,"CVodeQuadInit",1);
                          if (iVar3 == 0) {
                            iVar2 = 1;
                            retval = CVodeSetQuadErrCon(returnvalue_01,1);
                            iVar3 = check_retval(&retval,"CVodeSetQuadErrCon",1);
                            if (iVar3 == 0) {
                              retval = CVodeQuadSStolerances
                                                 (0xa0b5ed8d,0x3eb0c6f7a0b5ed8d,returnvalue_01);
                              iVar2 = 1;
                              iVar3 = check_retval(&retval,"CVodeQuadSStolerances",1);
                              if (iVar3 == 0) {
                                retval = CVodeSetMaxNumSteps(returnvalue_01,0x9c4);
                                iVar2 = 1;
                                iVar3 = check_retval(&retval,"CVodeSetMaxNumSteps",1);
                                if (iVar3 == 0) {
                                  iVar2 = 1;
                                  retval = CVodeAdjInit(returnvalue_01,0x96,1);
                                  iVar3 = check_retval(&retval,"CVodeAdjInit",1);
                                  if (iVar3 == 0) {
                                    printf("Forward integration ... ");
                                    iVar2 = 1;
                                    retval = CVodeF(0,returnvalue_01,y,&time,1,&ncheck);
                                    iVar3 = check_retval(&retval,"CVodeF",1);
                                    if (iVar3 == 0) {
                                      printf("done (ncheck = %d)\n",(ulong)(uint)ncheck);
                                      retval = CVodeGetQuad(returnvalue_01,&time,returnvalue_00);
                                      iVar2 = 1;
                                      iVar3 = check_retval(&retval,"CVodeGetQuad",1);
                                      if (iVar3 == 0) {
                                        local_40 = returnvalue_02;
                                        puts(
                                            "--------------------------------------------------------"
                                            );
                                        printf("G:          %12.4e \n",
                                               (int)**(undefined8 **)(*returnvalue_00 + 0x10));
                                        puts(
                                            "--------------------------------------------------------"
                                            );
                                        puts("\nFinal Statistics:");
                                        retval = CVodePrintAllStats(returnvalue_01,_stdout,0);
                                        pFVar5 = fopen("cvsRoberts_ASAi_dns_fwd_stats.csv","w");
                                        iVar2 = 1;
                                        retval = CVodePrintAllStats(returnvalue_01,pFVar5,1);
                                        fclose(pFVar5);
                                        local_88 = (N_Vector)N_VNew_Serial(3,sunctx);
                                        iVar3 = check_retval(local_88,"N_VNew_Serial",0);
                                        if (iVar3 == 0) {
                                          puVar1 = *(undefined8 **)((long)local_88->content + 0x10);
                                          *puVar1 = 0;
                                          puVar1[1] = 0;
                                          puVar1[2] = 0;
                                          local_70 = (N_Vector)N_VNew_Serial(3,sunctx);
                                          iVar3 = check_retval(local_70,"N_VNew",0);
                                          if (iVar3 == 0) {
                                            puVar1 = *(undefined8 **)
                                                      ((long)local_70->content + 0x10);
                                            *puVar1 = 0;
                                            puVar1[1] = 0;
                                            puVar1[2] = 0;
                                            puts(
                                                "\nCreate and allocate CVODES memory for backward run"
                                                );
                                            retval = CVodeCreateB(returnvalue_01,2,&indexB);
                                            iVar2 = 1;
                                            iVar3 = check_retval(&retval,"CVodeCreateB",1);
                                            if (iVar3 == 0) {
                                              retval = CVodeInitB(0,returnvalue_01,indexB,fB,
                                                                  local_88);
                                              iVar2 = 1;
                                              iVar3 = check_retval(&retval,"CVodeInitB",1);
                                              if (iVar3 == 0) {
                                                retval = CVodeSStolerancesB(0xa0b5ed8d,
                                                                            0x3e45798ee2308c3a,
                                                                            returnvalue_01,indexB);
                                                iVar2 = 1;
                                                iVar3 = check_retval(&retval,"CVodeSStolerancesB",1)
                                                ;
                                                if (iVar3 == 0) {
                                                  retval = CVodeSetUserDataB(returnvalue_01,indexB,
                                                                             returnvalue);
                                                  iVar2 = 1;
                                                  iVar3 = check_retval(&retval,"CVodeSetUserDataB",1
                                                                      );
                                                  if (iVar3 == 0) {
                                                    local_60 = (void *)SUNDenseMatrix(3,3,sunctx);
                                                    iVar3 = check_retval(local_60,"SUNDenseMatrix",0
                                                                        );
                                                    if (iVar3 == 0) {
                                                      local_50 = (void *)SUNLinSol_Dense(local_88,
                                                  local_60,sunctx);
                                                  iVar3 = check_retval(local_50,"SUNLinSol_Dense",0)
                                                  ;
                                                  pvVar4 = local_48;
                                                  if (iVar3 == 0) {
                                                    retval = CVodeSetLinearSolverB
                                                                       (returnvalue_01,indexB,
                                                                        local_50,local_60);
                                                    iVar2 = 1;
                                                    iVar3 = check_retval(&retval,
                                                  "CVodeSetLinearSolverB",1);
                                                  if (iVar3 == 0) {
                                                    retval = CVodeSetJacFnB(returnvalue_01,indexB,
                                                                            JacB);
                                                    iVar2 = 1;
                                                    iVar3 = check_retval(&retval,"CVodeSetJacFnB",1)
                                                    ;
                                                    if (iVar3 == 0) {
                                                      retval = CVodeQuadInitB(returnvalue_01,indexB,
                                                                              fQB,local_70);
                                                      iVar2 = 1;
                                                      iVar3 = check_retval(&retval,"CVodeQuadInitB",
                                                                           1);
                                                      if (iVar3 == 0) {
                                                        iVar2 = 1;
                                                        retval = CVodeSetQuadErrConB(returnvalue_01,
                                                                                     indexB,1);
                                                        iVar3 = check_retval(&retval,
                                                  "CVodeSetQuadErrConB",1);
                                                  if (iVar3 == 0) {
                                                    t = 1e-06;
                                                    retval = CVodeQuadSStolerancesB
                                                                       (returnvalue_01,indexB);
                                                    iVar2 = 1;
                                                    iVar3 = check_retval(&retval,
                                                  "CVodeQuadSStolerancesB",1);
                                                  if (iVar3 == 0) {
                                                    PrintHead(40000000.0);
                                                    iVar2 = 1;
                                                    retval = CVodeB(0,returnvalue_01,1);
                                                    iVar3 = check_retval(&retval,"CVodeB",1);
                                                    if (iVar3 == 0) {
                                                      retval = CVodeGetB(returnvalue_01,indexB,&time
                                                                         ,local_88);
                                                      iVar2 = 1;
                                                      iVar3 = check_retval(&retval,"CVodeGetB",1);
                                                      if (iVar3 == 0) {
                                                        retval = CVodeGetAdjY(0,returnvalue_01,y);
                                                        iVar2 = 1;
                                                        iVar3 = check_retval(&retval,"CVodeGetAdjY",
                                                                             1);
                                                        if (iVar3 == 0) {
                                                          PrintOutput1(time,t,y,local_88);
                                                          iVar2 = 1;
                                                          retval = CVodeB(0,returnvalue_01,1);
                                                          iVar3 = check_retval(&retval,"CVodeB",1);
                                                          if (iVar3 == 0) {
                                                            retval = CVodeGetB(returnvalue_01,indexB
                                                                               ,&time,local_88);
                                                            iVar2 = 1;
                                                            iVar3 = check_retval(&retval,"CVodeGetB"
                                                                                 ,1);
                                                            if (iVar3 == 0) {
                                                              retval = CVodeGetQuadB(returnvalue_01,
                                                                                     indexB,&time,
                                                                                     local_70);
                                                              iVar2 = 1;
                                                              iVar3 = check_retval(&retval,
                                                  "CVodeGetQuadB",1);
                                                  if (iVar3 == 0) {
                                                    retval = CVodeGetAdjY(0,returnvalue_01,y);
                                                    iVar2 = 1;
                                                    iVar3 = check_retval(&retval,"CVodeGetAdjY",1);
                                                    if (iVar3 == 0) {
                                                      PrintOutput(time,y,local_88,local_70);
                                                      puts("\nFinal Statistics:");
                                                      uVar6 = CVodeGetAdjCVodeBmem
                                                                        (returnvalue_01,indexB);
                                                      retval = CVodePrintAllStats(uVar6,_stdout,0);
                                                      local_68 = fopen(
                                                  "cvsRoberts_ASAi_dns_bkw1_stats.csv","w");
                                                  uVar6 = CVodeGetAdjCVodeBmem
                                                                    (returnvalue_01,indexB);
                                                  iVar2 = 1;
                                                  retval = CVodePrintAllStats(uVar6,local_68,1);
                                                  fclose(local_68);
                                                  puVar1 = *(undefined8 **)
                                                            ((long)local_88->content + 0x10);
                                                  puVar1[2] = 0;
                                                  *puVar1 = 0;
                                                  puVar1[1] = 0;
                                                  puVar1 = *(undefined8 **)
                                                            ((long)local_70->content + 0x10);
                                                  *puVar1 = 0;
                                                  puVar1[1] = 0;
                                                  puVar1[2] = 0;
                                                  puts(
                                                  "\nRe-initialize CVODES memory for backward run");
                                                  retval = CVodeReInitB(0,returnvalue_01,indexB,
                                                                        local_88);
                                                  iVar3 = check_retval(&retval,"CVodeReInitB",1);
                                                  if (iVar3 == 0) {
                                                    retval = CVodeQuadReInitB(returnvalue_01,indexB,
                                                                              local_70);
                                                    iVar2 = 1;
                                                    iVar3 = check_retval(&retval,"CVodeQuadReInitB",
                                                                         1);
                                                    if (iVar3 == 0) {
                                                      PrintHead(50.0);
                                                      iVar2 = 1;
                                                      retval = CVodeB(0,returnvalue_01,1);
                                                      iVar3 = check_retval(&retval,"CVodeB",1);
                                                      if (iVar3 == 0) {
                                                        retval = CVodeGetB(returnvalue_01,indexB,
                                                                           &time,local_88);
                                                        iVar2 = 1;
                                                        iVar3 = check_retval(&retval,"CVodeGetB",1);
                                                        if (iVar3 == 0) {
                                                          retval = CVodeGetAdjY(0,returnvalue_01,y);
                                                          iVar2 = 1;
                                                          iVar3 = check_retval(&retval,
                                                  "CVodeGetAdjY",1);
                                                  if (iVar3 == 0) {
                                                    PrintOutput1(time,t,y,local_88);
                                                    iVar2 = 1;
                                                    retval = CVodeB(0,returnvalue_01,1);
                                                    iVar3 = check_retval(&retval,"CVodeB",1);
                                                    if (iVar3 == 0) {
                                                      retval = CVodeGetB(returnvalue_01,indexB,&time
                                                                         ,local_88);
                                                      iVar2 = 1;
                                                      iVar3 = check_retval(&retval,"CVodeGetB",1);
                                                      if (iVar3 == 0) {
                                                        retval = CVodeGetQuadB(returnvalue_01,indexB
                                                                               ,&time,local_70);
                                                        iVar2 = 1;
                                                        iVar3 = check_retval(&retval,"CVodeGetQuadB"
                                                                             ,1);
                                                        if (iVar3 == 0) {
                                                          retval = CVodeGetAdjY(0,returnvalue_01,y);
                                                          iVar2 = 1;
                                                          iVar3 = check_retval(&retval,
                                                  "CVodeGetAdjY",1);
                                                  if (iVar3 == 0) {
                                                    PrintOutput(time,y,local_88,local_70);
                                                    puts("\nFinal Statistics:");
                                                    uVar6 = CVodeGetAdjCVodeBmem
                                                                      (returnvalue_01,indexB);
                                                    iVar2 = 0;
                                                    retval = CVodePrintAllStats(uVar6,_stdout,0);
                                                    local_68 = fopen(
                                                  "cvsRoberts_ASAi_dns_bkw2_stats.csv","w");
                                                  uVar6 = CVodeGetAdjCVodeBmem
                                                                    (returnvalue_01,indexB);
                                                  pFVar5 = local_68;
                                                  retval = CVodePrintAllStats(uVar6,local_68,1);
                                                  fclose(pFVar5);
                                                  CVodeFree(&local_38);
                                                  N_VDestroy(y);
                                                  N_VDestroy(returnvalue_00);
                                                  N_VDestroy(local_88);
                                                  N_VDestroy(local_70);
                                                  SUNLinSolFree(local_40);
                                                  SUNMatDestroy(pvVar4);
                                                  SUNLinSolFree(local_50);
                                                  SUNMatDestroy(local_60);
                                                  SUNContext_Free(&sunctx);
                                                  free(returnvalue);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;
  void* cvode_mem;
  FILE* FID;

  sunrealtype reltolQ, abstolQ;
  N_Vector y, q;

  int steps;

  int indexB;

  sunrealtype reltolB, abstolB, abstolQB;
  N_Vector yB, qB;

  sunrealtype time;
  int retval, ncheck;

  CVadjCheckPointRec* ckpnt;

  data = NULL;
  A = AB = NULL;
  LS = LSB  = NULL;
  cvode_mem = NULL;
  ckpnt     = NULL;
  y = yB = qB = NULL;

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("ODE: dy1/dt = -p1*y1 + p2*y2*y3\n");
  printf("     dy2/dt =  p1*y1 - p2*y2*y3 - p3*(y2)^2\n");
  printf("     dy3/dt =  p3*(y2)^2\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initialize y */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  Ith(y, 1) = SUN_RCONST(1.0);
  Ith(y, 2) = ZERO;
  Ith(y, 3) = ZERO;

  /* Initialize q */
  q = N_VNew_Serial(1, sunctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Set the scalar realtive and absolute tolerances reltolQ and abstolQ */
  reltolQ = RTOL;
  abstolQ = ATOLq;

  /* Create and allocate CVODES memory for forward run */
  printf("Create and allocate CVODES memory for forward runs\n");

  /* Call CVodeCreate to create the solver memory and specify the
     Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
     user's right hand side function in y'=f(t,y), the initial time T0, and
     the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeWFtolerances to specify a user-supplied function ewt that sets
     the multiplicative error weights w_i for use in the weighted RMS norm */
  retval = CVodeWFtolerances(cvode_mem, ewt);
  if (check_retval(&retval, "CVodeWFtolerances", 1)) { return (1); }

  /* Attach user data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Call CVodeQuadInit to allocate initernal memory and initialize
     quadrature integration*/
  retval = CVodeQuadInit(cvode_mem, fQ, q);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  /* Call CVodeSetQuadErrCon to specify whether or not the quadrature variables
     are to be used in the step size control mechanism within CVODES. Call
     CVodeQuadSStolerances or CVodeQuadSVtolerances to specify the integration
     tolerances for the quadrature variables. */
  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  /* Call CVodeQuadSStolerances to specify scalar relative and absolute
     tolerances. */
  retval = CVodeQuadSStolerances(cvode_mem, reltolQ, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Allocate global memory */

  /* Call CVodeAdjInit to update CVODES memory block by allocting the internal
     memory needed for backward integration.*/
  steps = STEPS; /* no. of integration steps between two consecutive ckeckpoints*/
  retval = CVodeAdjInit(cvode_mem, steps, CV_HERMITE);
  /*
  retval = CVodeAdjInit(cvode_mem, steps, CV_POLYNOMIAL);
  */
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("Forward integration ... ");

  /* Call CVodeF to integrate the forward problem over an interval in time and
     saves checkpointing data */
  retval = CVodeF(cvode_mem, TOUT, y, &time, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("done (ncheck = %d)\n", ncheck);

  retval = CVodeGetQuad(cvode_mem, &time, q);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %12.4Le \n", Ith(q, 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("G:          %12.4e \n", Ith(q, 1));
#else
  printf("G:          %12.4e \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n");

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(cvode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_fwd_stats.csv", "w");
  retval = CVodePrintAllStats(cvode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Test check point linked list
     (uncomment next block to print check point information) */

  /*
  {
    int i;

    printf("\nList of Check Points (ncheck = %d)\n\n", ncheck);
    ckpnt = (CVadjCheckPointRec *) malloc ( (ncheck+1)*sizeof(CVadjCheckPointRec));
    CVodeGetAdjCheckPointsInfo(cvode_mem, ckpnt);
    for (i=0;i<=ncheck;i++) {
      printf("Address:       %p\n",ckpnt[i].my_addr);
      printf("Next:          %p\n",ckpnt[i].next_addr);
      printf("Time interval: %le  %le\n",ckpnt[i].t0, ckpnt[i].t1);
      printf("Step number:   %ld\n",ckpnt[i].nstep);
      printf("Order:         %d\n",ckpnt[i].order);
      printf("Step size:     %le\n",ckpnt[i].step);
      printf("\n");
    }

  }
  */

  /* Initialize yB */
  yB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ZERO;

  /* Initialize qB */
  qB = N_VNew_Serial(NP, sunctx);
  if (check_retval((void*)qB, "N_VNew", 0)) { return (1); }
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  /* Set the scalar relative tolerance reltolB */
  reltolB = RTOL;

  /* Set the scalar absolute tolerance abstolB */
  abstolB = ATOLl;

  /* Set the scalar absolute tolerance abstolQB */
  abstolQB = ATOLq;

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");

  /* Call CVodeCreateB to specify the solution method for the backward
     problem. */
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  /* Call CVodeInitB to allocate internal memory and initialize the
     backward problem. */
  retval = CVodeInitB(cvode_mem, indexB, fB, TB1, yB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }

  /* Set the scalar relative and absolute tolerances. */
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  /* Attach the user data for backward problem. */
  retval = CVodeSetUserDataB(cvode_mem, indexB, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, AB);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine JacB */
  retval = CVodeSetJacFnB(cvode_mem, indexB, JacB);
  if (check_retval(&retval, "CVodeSetJacFnB", 1)) { return (1); }

  /* Call CVodeQuadInitB to allocate internal memory and initialize backward
     quadrature integration. */
  retval = CVodeQuadInitB(cvode_mem, indexB, fQB, qB);
  if (check_retval(&retval, "CVodeQuadInitB", 1)) { return (1); }

  /* Call CVodeSetQuadErrCon to specify whether or not the quadrature variables
     are to be used in the step size control mechanism within CVODES. Call
     CVodeQuadSStolerances or CVodeQuadSVtolerances to specify the integration
     tolerances for the quadrature variables. */
  retval = CVodeSetQuadErrConB(cvode_mem, indexB, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Call CVodeQuadSStolerancesB to specify the scalar relative and absolute tolerances
     for the backward problem. */
  retval = CVodeQuadSStolerancesB(cvode_mem, indexB, reltolB, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  /* Backward Integration */

  PrintHead(TB1);

  /* First get results at t = TBout1 */

  /* Call CVodeB to integrate the backward ODE problem. */
  retval = CVodeB(cvode_mem, TBout1, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  /* Call CVodeGetB to get yB of the backward ODE problem. */
  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  /* Call CVodeGetAdjY to get the interpolated value of the forward solution
     y during a backward integration. */
  retval = CVodeGetAdjY(cvode_mem, TBout1, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput1(time, TBout1, y, yB);

  /* Then at t = T0 */

  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  /* Call CVodeGetQuadB to get the quadrature solution vector after a
     successful return from CVodeB. */
  retval = CVodeGetQuadB(cvode_mem, indexB, &time, qB);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, T0, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput(time, y, yB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), stdout,
                              SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), FID,
                              SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Reinitialize backward phase (new tB0) */

  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ZERO;

  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  printf("\nRe-initialize CVODES memory for backward run\n");

  retval = CVodeReInitB(cvode_mem, indexB, TB2, yB);
  if (check_retval(&retval, "CVodeReInitB", 1)) { return (1); }

  retval = CVodeQuadReInitB(cvode_mem, indexB, qB);
  if (check_retval(&retval, "CVodeQuadReInitB", 1)) { return (1); }

  PrintHead(TB2);

  /* First get results at t = TBout1 */

  retval = CVodeB(cvode_mem, TBout1, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, TBout1, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput1(time, TBout1, y, yB);

  /* Then at t = T0 */

  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB, &time, qB);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, T0, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput(time, y, yB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), stdout,
                              SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_bkw2_stats.csv", "w");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), FID,
                              SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  CVodeFree(&cvode_mem);
  N_VDestroy(y);
  N_VDestroy(q);
  N_VDestroy(yB);
  N_VDestroy(qB);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  SUNContext_Free(&sunctx);

  if (ckpnt != NULL) { free(ckpnt); }
  free(data);

  return (0);
}